

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void t1_enc_clnpass(opj_t1_t *t1,int bpno,int orient,int *nmsedec,int cblksty)

{
  uint orient_00;
  uint uVar1;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  opj_mqc_t *mqc;
  int vsc;
  int runlen;
  int agg;
  int one;
  int k;
  int j;
  int i;
  int *in_stack_ffffffffffffff68;
  int d;
  uint in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined2 in_stack_ffffffffffffffb8;
  bool bVar2;
  undefined1 in_stack_ffffffffffffffbb;
  bool bVar3;
  bool bVar4;
  byte in_stack_ffffffffffffffbe;
  byte in_stack_ffffffffffffffbf;
  opj_t1_t *t1_00;
  int local_34;
  uint uVar5;
  int partial;
  int local_24;
  int vsc_00;
  
  t1_00 = *(opj_t1_t **)(in_RDI + 8);
  *in_RCX = 0;
  orient_00 = 1 << ((char)in_ESI + 6U & 0x1f);
  partial = 0;
  do {
    if (*(int *)(in_RDI + 0x2c) <= partial) {
      return;
    }
    for (vsc_00 = 0; vsc_00 < *(int *)(in_RDI + 0x28); vsc_00 = vsc_00 + 1) {
      if (partial + 3 < *(int *)(in_RDI + 0x2c)) {
        if ((in_R8D & 8) == 0) {
          in_stack_ffffffffffffffbe = true;
          bVar4 = (bool)in_stack_ffffffffffffffbe;
          if ((((*(ushort *)
                  (*(long *)(in_RDI + 0x20) +
                  (long)((partial + 1) * *(int *)(in_RDI + 0x38) + vsc_00 + 1) * 2) & 0x50ff) == 0)
              && (in_stack_ffffffffffffffbe = true, bVar4 = (bool)in_stack_ffffffffffffffbe,
                 (*(ushort *)
                   (*(long *)(in_RDI + 0x20) +
                   (long)((partial + 2) * *(int *)(in_RDI + 0x38) + vsc_00 + 1) * 2) & 0x50ff) == 0)
              ) && (in_stack_ffffffffffffffbe = true, bVar4 = (bool)in_stack_ffffffffffffffbe,
                   (*(ushort *)
                     (*(long *)(in_RDI + 0x20) +
                     (long)((partial + 3) * *(int *)(in_RDI + 0x38) + vsc_00 + 1) * 2) & 0x50ff) ==
                   0)) {
            in_stack_ffffffffffffffbe =
                 (*(ushort *)
                   (*(long *)(in_RDI + 0x20) +
                   (long)((partial + 4) * *(int *)(in_RDI + 0x38) + vsc_00 + 1) * 2) & 0x50ff) != 0;
            bVar4 = (bool)in_stack_ffffffffffffffbe;
          }
        }
        else {
          in_stack_ffffffffffffffbf = true;
          bVar4 = (bool)in_stack_ffffffffffffffbf;
          if ((((*(ushort *)
                  (*(long *)(in_RDI + 0x20) +
                  (long)((partial + 1) * *(int *)(in_RDI + 0x38) + vsc_00 + 1) * 2) & 0x50ff) == 0)
              && (in_stack_ffffffffffffffbf = true, bVar4 = (bool)in_stack_ffffffffffffffbf,
                 (*(ushort *)
                   (*(long *)(in_RDI + 0x20) +
                   (long)((partial + 2) * *(int *)(in_RDI + 0x38) + vsc_00 + 1) * 2) & 0x50ff) == 0)
              ) && (in_stack_ffffffffffffffbf = true, bVar4 = (bool)in_stack_ffffffffffffffbf,
                   (*(ushort *)
                     (*(long *)(in_RDI + 0x20) +
                     (long)((partial + 3) * *(int *)(in_RDI + 0x38) + vsc_00 + 1) * 2) & 0x50ff) ==
                   0)) {
            in_stack_ffffffffffffffbf =
                 (*(ushort *)
                   (*(long *)(in_RDI + 0x20) +
                   (long)((partial + 4) * *(int *)(in_RDI + 0x38) + vsc_00 + 1) * 2) & 0x50b9) != 0;
            bVar4 = (bool)in_stack_ffffffffffffffbf;
          }
        }
        uVar5 = (uint)((bVar4 ^ 0xffU) & 1);
      }
      else {
        uVar5 = 0;
      }
      if (uVar5 == 0) {
        local_34 = 0;
LAB_002d9ea9:
        local_24 = partial + local_34;
        while( true ) {
          bVar4 = false;
          if (local_24 < partial + 4) {
            bVar4 = local_24 < *(int *)(in_RDI + 0x2c);
          }
          if (bVar4 == false) break;
          bVar3 = false;
          if (((in_R8D & 8) != 0) &&
             (in_stack_ffffffffffffffbb = true, bVar3 = (bool)in_stack_ffffffffffffffbb,
             local_24 != partial + 3)) {
            in_stack_ffffffffffffffbb = local_24 == *(int *)(in_RDI + 0x2c) + -1;
            bVar3 = (bool)in_stack_ffffffffffffffbb;
          }
          bVar2 = uVar5 != 0 && local_24 == partial + local_34;
          in_stack_ffffffffffffff70 = (uint)bVar2;
          t1_enc_clnpass_step(t1_00,(flag_t *)
                                    CONCAT17(in_stack_ffffffffffffffbf,
                                             CONCAT16(in_stack_ffffffffffffffbe,
                                                      CONCAT15(bVar4,CONCAT14(bVar3,CONCAT13(
                                                  in_stack_ffffffffffffffbb,
                                                  CONCAT12(bVar2,in_stack_ffffffffffffffb8)))))),
                              in_RCX,orient_00,in_ESI,in_EDX,(int *)CONCAT44(orient_00,uVar5),
                              partial,vsc_00);
          local_24 = local_24 + 1;
          in_stack_ffffffffffffff68 = in_RCX;
        }
      }
      else {
        local_34 = 0;
        while ((local_34 < 4 &&
               (uVar1 = int_abs(*(int *)(*(long *)(in_RDI + 0x18) +
                                        (long)((partial + local_34) * *(int *)(in_RDI + 0x28) +
                                              vsc_00) * 4)), (uVar1 & orient_00) == 0))) {
          local_34 = local_34 + 1;
        }
        t1_00[3].cinfo = (opj_common_ptr)&t1_00[2].datasize;
        d = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
        mqc_encode((opj_mqc_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),d);
        if (local_34 != 4) {
          t1_00[3].cinfo = (opj_common_ptr)&t1_00[2].flags_stride;
          mqc_encode((opj_mqc_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),d);
          mqc_encode((opj_mqc_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),d);
          goto LAB_002d9ea9;
        }
      }
    }
    partial = partial + 4;
  } while( true );
}

Assistant:

static void t1_enc_clnpass(
		opj_t1_t *t1,
		int bpno,
		int orient,
		int *nmsedec,
		int cblksty)
{
	int i, j, k, one, agg, runlen, vsc;
	
	opj_mqc_t *mqc = t1->mqc;	/* MQC component */
	
	*nmsedec = 0;
	one = 1 << (bpno + T1_NMSEDEC_FRACBITS);
	for (k = 0; k < t1->h; k += 4) {
		for (i = 0; i < t1->w; ++i) {
			if (k + 3 < t1->h) {
				if (cblksty & J2K_CCP_CBLKSTY_VSC) {
					agg = !(MACRO_t1_flags(1 + k,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
						|| MACRO_t1_flags(1 + k + 1,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
						|| MACRO_t1_flags(1 + k + 2,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
						|| (MACRO_t1_flags(1 + k + 3,1 + i) 
						& (~(T1_SIG_S | T1_SIG_SE | T1_SIG_SW |	T1_SGN_S))) & (T1_SIG | T1_VISIT | T1_SIG_OTH));
				} else {
					agg = !(MACRO_t1_flags(1 + k,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
						|| MACRO_t1_flags(1 + k + 1,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
						|| MACRO_t1_flags(1 + k + 2,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
						|| MACRO_t1_flags(1 + k + 3,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH));
				}
			} else {
				agg = 0;
			}
			if (agg) {
				for (runlen = 0; runlen < 4; ++runlen) {
					if (int_abs(t1->data[((k + runlen)*t1->w) + i]) & one)
						break;
				}
				mqc_setcurctx(mqc, T1_CTXNO_AGG);
				mqc_encode(mqc, runlen != 4);
				if (runlen == 4) {
					continue;
				}
				mqc_setcurctx(mqc, T1_CTXNO_UNI);
				mqc_encode(mqc, runlen >> 1);
				mqc_encode(mqc, runlen & 1);
			} else {
				runlen = 0;
			}
			for (j = k + runlen; j < k + 4 && j < t1->h; ++j) {
				vsc = ((cblksty & J2K_CCP_CBLKSTY_VSC) && (j == k + 3 || j == t1->h - 1)) ? 1 : 0;
				t1_enc_clnpass_step(
						t1,
						&t1->flags[((j+1) * t1->flags_stride) + i + 1],
						&t1->data[(j * t1->w) + i],
						orient,
						bpno,
						one,
						nmsedec,
						agg && (j == k + runlen),
						vsc);
			}
		}
	}
}